

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
jsoncons::detail::optional<std::vector<double,_std::allocator<double>_>_>::swap
          (optional<std::vector<double,_std::allocator<double>_>_> *this,
          optional<std::vector<double,_std::allocator<double>_>_> *other)

{
  bool bVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  optional<std::vector<double,_std::allocator<double>_>_> *this_00;
  optional<std::vector<double,_std::allocator<double>_>_> local_38;
  
  bVar1 = this->has_value_;
  if (bVar1 == other->has_value_) {
    if (bVar1 != false) {
      pvVar6 = value(this);
      pvVar7 = value(other);
      pdVar2 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar3 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar4 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar3;
      (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar2;
    }
  }
  else {
    this_00 = this;
    if (bVar1 != false) {
      this_00 = other;
      other = this;
    }
    pvVar6 = value(other);
    local_38.has_value_ = true;
    std::vector<double,_std::allocator<double>_>::vector(&local_38.field_1.value_,pvVar6);
    operator=(this_00,&local_38);
    if (local_38.has_value_ == true) {
      if (local_38.field_1.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.field_1.value_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.field_1.value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage - local_38.field_1._0_8_);
      }
      local_38.has_value_ = false;
    }
    if (other->has_value_ == true) {
      pdVar2 = (other->field_1).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar2 != (pointer)0x0) {
        operator_delete(pdVar2,(long)(other->field_1).value_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
      }
      other->has_value_ = false;
    }
  }
  return;
}

Assistant:

void swap(optional& other) noexcept(std::is_nothrow_move_constructible<T>::value /*&&
                                            std::is_nothrow_swappable<T>::value*/)
        {
            const bool contains_a_value = has_value();
            if (contains_a_value == other.has_value())
            {
                if (contains_a_value)
                {
                    using std::swap;
                    swap(**this, *other);
                }
            }
            else
            {
                optional& source = contains_a_value ? *this : other;
                optional& target = contains_a_value ? other : *this;
                target = optional<T>(*source);
                source.reset();
            }
        }